

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::InitDefaultsImpl(void)

{
  NearestNeighborsIndex *pNVar1;
  KNearestNeighborsClassifier *pKVar2;
  Int64Parameter *pIVar3;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NearestNeighbors.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier> *)
             _KNearestNeighborsClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NearestNeighborsIndex>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::NearestNeighborsIndex> *)
                   _NearestNeighborsIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::UniformWeighting>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::UniformWeighting> *)
                   _UniformWeighting_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::InverseDistanceWeighting>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::InverseDistanceWeighting> *)
                     _InverseDistanceWeighting_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::LinearIndex>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::LinearIndex> *)
                   _LinearIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SingleKdTreeIndex>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SingleKdTreeIndex> *)
                   _SingleKdTreeIndex_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SquaredEuclideanDistance>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SquaredEuclideanDistance> *)
                     _SquaredEuclideanDistance_default_instance_);
  pNVar1 = NearestNeighborsIndex::internal_default_instance();
  pKVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier> *)
                      _KNearestNeighborsClassifier_default_instance_);
  pKVar2->nearestneighborsindex_ = pNVar1;
  pIVar3 = Int64Parameter::internal_default_instance();
  pKVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::KNearestNeighborsClassifier> *)
                      _KNearestNeighborsClassifier_default_instance_);
  pKVar2->numberofneighbors_ = pIVar3;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  _KNearestNeighborsClassifier_default_instance_.DefaultConstruct();
  _NearestNeighborsIndex_default_instance_.DefaultConstruct();
  _UniformWeighting_default_instance_.DefaultConstruct();
  _InverseDistanceWeighting_default_instance_.DefaultConstruct();
  _LinearIndex_default_instance_.DefaultConstruct();
  _SingleKdTreeIndex_default_instance_.DefaultConstruct();
  _SquaredEuclideanDistance_default_instance_.DefaultConstruct();
  _KNearestNeighborsClassifier_default_instance_.get_mutable()->nearestneighborsindex_ = const_cast< ::CoreML::Specification::NearestNeighborsIndex*>(
      ::CoreML::Specification::NearestNeighborsIndex::internal_default_instance());
  _KNearestNeighborsClassifier_default_instance_.get_mutable()->numberofneighbors_ = const_cast< ::CoreML::Specification::Int64Parameter*>(
      ::CoreML::Specification::Int64Parameter::internal_default_instance());
}